

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

void __thiscall
ktxApp::ktxApp(ktxApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  initializer_list<argparser::option> __l;
  allocator_type local_b9;
  option local_b8;
  char *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  char *local_78;
  undefined4 local_70;
  int *local_68;
  undefined4 local_60;
  char *local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  this->_vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_001349e8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->version = version;
  this->defaultVersion = defaultVersion;
  this->options = options;
  local_b8.name = "help";
  local_b8.has_arg = no_argument;
  local_b8.flag = (int *)0x0;
  local_b8.val = 0x68;
  local_98 = "version";
  local_90 = 0;
  local_88 = 0;
  local_80 = 0x76;
  local_68 = &options->test;
  local_78 = "test";
  local_70 = 0;
  local_60 = 1;
  local_58 = "-NSDocumentRevisionsDebugMode";
  local_48 = 0;
  local_40 = 10000;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  local_20 = 0;
  __l._M_len = 5;
  __l._M_array = &local_b8;
  local_50 = local_60;
  std::vector<argparser::option,_std::allocator<argparser::option>_>::vector
            (&this->option_list,__l,&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->short_opts,"hv",(allocator<char> *)&local_b8);
  return;
}

Assistant:

ktxApp(std::string& version, std::string& defaultVersion,
           commandOptions& options)
        : version(version), defaultVersion(defaultVersion),
          options(options) { }